

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O1

void __thiscall
spvtools::utils::SmallVector<unsigned_int,_2UL>::SmallVector
          (SmallVector<unsigned_int,_2UL> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  pointer puVar1;
  pointer puVar2;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> __ptr;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> this_00;
  ulong uVar3;
  unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_01;
  long lVar4;
  pointer __p;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  
  this->_vptr_SmallVector = (_func_int **)&PTR__SmallVector_00b15d78;
  this->size_ = 0;
  this->small_data_ = (uint *)this->buffer;
  (this->large_data_)._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  puVar1 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = (long)puVar2 - (long)puVar1 >> 2;
  if (uVar3 < 3) {
    this->size_ = uVar3;
    if (puVar2 != puVar1) {
      lVar4 = 0;
      do {
        *(uint *)this->buffer[lVar4].data._M_elems = puVar1[lVar4];
        lVar4 = lVar4 + 1;
      } while (uVar3 + (uVar3 == 0) != lVar4);
    }
  }
  else {
    this_01 = &this->large_data_;
    this_00._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18)
    ;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(this_00._M_head_impl,vec);
    local_20 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    __ptr._M_head_impl =
         (this_01->_M_t).
         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
         _M_head_impl;
    (this_01->_M_t).
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = this_00._M_head_impl;
    if (__ptr._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 this_01,__ptr._M_head_impl);
    }
    if (local_20 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_20,local_20);
    }
  }
  return;
}

Assistant:

SmallVector(const std::vector<T>& vec) : SmallVector() {
    if (vec.size() > small_size) {
      large_data_ = MakeUnique<std::vector<T>>(vec);
    } else {
      size_ = vec.size();
      for (uint32_t i = 0; i < size_; i++) {
        new (small_data_ + i) T(vec[i]);
      }
    }
  }